

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutput.cpp
# Opt level: O2

void __thiscall
Test::TextOutput::finishTestMethod
          (TextOutput *this,string *suiteName,string *methodName,string *argString,bool withSuccess)

{
  ostream *poVar1;
  char *pcVar2;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->mode < 2 || this->mode == 2 && !withSuccess) {
    poVar1 = std::operator<<(this->stream,"Test-method \'");
    poVar1 = std::operator<<(poVar1,(string *)methodName);
    poVar1 = std::operator<<(poVar1,'(');
    if (argString->_M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_40,"",&local_41);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,argString);
    }
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,")\' finished with ");
    pcVar2 = "errors!";
    if (withSuccess) {
      pcVar2 = "success!";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(&local_40);
  }
  return;
}

Assistant:

void TextOutput::finishTestMethod(
    const std::string &suiteName, const std::string &methodName, const std::string &argString, const bool withSuccess) {
  if (mode <= Debug || (mode <= Verbose && !withSuccess))
    stream << "Test-method '" << methodName << '(' << (argString.empty() ? "" : argString) << ")' finished with "
           << (withSuccess ? "success!" : "errors!") << std::endl;
}